

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

void __thiscall
ktxValidator::skipPadding(ktxValidator *this,validationContext *ctx,uint32_t alignment)

{
  uint uVar1;
  issue *piVar2;
  int *piVar3;
  char *args;
  issue iStack_68;
  issue local_40;
  
  validationContext::skipPadding(ctx,alignment);
  uVar1 = *(uint *)(ctx->inp + *(long *)(*(long *)ctx->inp + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    if ((uVar1 & 2) == 0) {
      return;
    }
    piVar2 = &local_40;
    ::issue::issue(&local_40,&IOError.UnexpectedEOF);
    addIssue<int>(this,eFatal,&local_40,0);
  }
  else {
    ::issue::issue(&iStack_68,&IOError.FileRead);
    piVar3 = __errno_location();
    args = strerror(*piVar3);
    addIssue<char*>(this,eFatal,&iStack_68,args);
    piVar2 = &iStack_68;
  }
  std::__cxx11::string::~string((string *)&piVar2->message);
  return;
}

Assistant:

void skipPadding(validationContext& ctx, uint32_t alignment) {
        ctx.skipPadding(alignment);
        if (ctx.inp->fail())
            addIssue(logger::eFatal, IOError.FileRead, strerror(errno));
        else if (ctx.inp->eof())
            addIssue(logger::eFatal, IOError.UnexpectedEOF, 0);
    }